

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandIProve(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Abc_Frame_t *p;
  Abc_Ntk_t *pNtk;
  int iVar1;
  uint uVar2;
  int iVar3;
  abctime aVar4;
  int *__ptr;
  abctime aVar5;
  ulong uVar6;
  abctime time;
  char *pcVar7;
  char *pcVar8;
  ulong uVar9;
  Prove_Params_t Params;
  Abc_Cex_t *pCex;
  Abc_Ntk_t *local_a8;
  Abc_Frame_t *local_a0;
  Abc_Ntk_t *local_98;
  Prove_Params_t local_90;
  Abc_Cex_t *local_38;
  
  local_a0 = pAbc;
  local_98 = Abc_FrameReadNtk(pAbc);
  Prove_ParamsSetDefault(&local_90);
  local_90.fUseRewriting = 1;
  local_90.fVerbose = 0;
  Extra_UtilGetoptReset();
  do {
    while (iVar1 = Extra_UtilGetopt(argc,argv,"NCFGLIrfbvh"), pNtk = local_98,
          iVar3 = globalUtilOptind, 0x61 < iVar1) {
      if (iVar1 < 0x72) {
        if (iVar1 == 0x62) {
          local_90.fUseBdds = local_90.fUseBdds ^ 1;
        }
        else {
          if (iVar1 != 0x66) goto switchD_0021e809_caseD_44;
          local_90.fUseFraiging = local_90.fUseFraiging ^ 1;
        }
      }
      else if (iVar1 == 0x72) {
        local_90.fUseRewriting = local_90.fUseRewriting ^ 1;
      }
      else {
        if (iVar1 != 0x76) goto switchD_0021e809_caseD_44;
        local_90.fVerbose = local_90.fVerbose ^ 1;
      }
    }
    switch(iVar1) {
    case 0x43:
      if (argc <= globalUtilOptind) {
        pcVar8 = "Command line switch \"-C\" should be followed by an integer.\n";
LAB_0021e988:
        Abc_Print(-1,pcVar8);
        goto switchD_0021e809_caseD_44;
      }
      local_90.nMiteringLimitStart = atoi(argv[globalUtilOptind]);
      uVar2 = local_90.nMiteringLimitStart;
      break;
    case 0x44:
    case 0x45:
    case 0x48:
    case 0x4a:
    case 0x4b:
    case 0x4d:
      goto switchD_0021e809_caseD_44;
    case 0x46:
      if (argc <= globalUtilOptind) {
        pcVar8 = "Command line switch \"-F\" should be followed by an integer.\n";
        goto LAB_0021e988;
      }
      local_90.nFraigingLimitStart = atoi(argv[globalUtilOptind]);
      uVar2 = local_90.nFraigingLimitStart;
      break;
    case 0x47:
      if (argc <= globalUtilOptind) {
        pcVar8 = "Command line switch \"-G\" should be followed by an integer.\n";
        goto LAB_0021e988;
      }
      uVar2 = atoi(argv[globalUtilOptind]);
      local_90.nFraigingLimitMulti = (float)(int)uVar2;
      break;
    case 0x49:
      if (argc <= globalUtilOptind) {
        pcVar8 = "Command line switch \"-I\" should be followed by an integer.\n";
        goto LAB_0021e988;
      }
      uVar2 = atoi(argv[globalUtilOptind]);
      local_90.nTotalInspectLimit = (ABC_INT64_T)(int)uVar2;
      break;
    case 0x4c:
      if (argc <= globalUtilOptind) {
        pcVar8 = "Command line switch \"-L\" should be followed by an integer.\n";
        goto LAB_0021e988;
      }
      local_90.nMiteringLimitLast = atoi(argv[globalUtilOptind]);
      uVar2 = local_90.nMiteringLimitLast;
      break;
    case 0x4e:
      if (argc <= globalUtilOptind) {
        pcVar8 = "Command line switch \"-N\" should be followed by an integer.\n";
        goto LAB_0021e988;
      }
      local_90.nItersMax = atoi(argv[globalUtilOptind]);
      uVar2 = local_90.nItersMax;
      break;
    default:
      if (iVar1 == -1) {
        if (local_98 == (Abc_Ntk_t *)0x0) {
          pcVar8 = "Empty network.\n";
        }
        else {
          if (local_98->nObjCounts[8] < 1) {
            aVar4 = Abc_Clock();
            if (pNtk->ntkType == ABC_NTK_STRASH) {
              local_a8 = Abc_NtkDup(pNtk);
            }
            else {
              local_a8 = Abc_NtkStrash(pNtk,0,0,0);
            }
            p = local_a0;
            iVar3 = Abc_NtkIvyProve(&local_a8,&local_90);
            uVar9 = 0xffffffff;
            if (iVar3 != 0) goto LAB_0021ebb4;
            __ptr = Abc_NtkVerifySimulatePattern(pNtk,local_a8->pModel);
            uVar2 = pNtk->vCos->nSize;
            uVar9 = 0xffffffff;
            uVar6 = 0;
            if (0 < (int)uVar2) goto LAB_0021eb79;
            goto LAB_0021eb90;
          }
          pcVar8 = "The network has registers. Use \"dprove\".\n";
        }
        iVar3 = -1;
        goto LAB_0021eadc;
      }
      goto switchD_0021e809_caseD_44;
    }
    globalUtilOptind = iVar3 + 1;
  } while (-1 < (int)uVar2);
switchD_0021e809_caseD_44:
  Abc_Print(-2,"usage: iprove [-NCFGLI num] [-rfbvh]\n");
  Abc_Print(-2,"\t         performs CEC using a new method\n");
  Abc_Print(-2,"\t-N num : max number of iterations [default = %d]\n",
            (ulong)(uint)local_90.nItersMax);
  Abc_Print(-2,"\t-C num : max starting number of conflicts in mitering [default = %d]\n",
            (ulong)(uint)local_90.nMiteringLimitStart);
  Abc_Print(-2,"\t-F num : max starting number of conflicts in fraiging [default = %d]\n",
            (ulong)(uint)local_90.nFraigingLimitStart);
  Abc_Print(-2,"\t-G num : multiplicative coefficient for fraiging [default = %d]\n",
            (ulong)(uint)(int)local_90.nFraigingLimitMulti);
  Abc_Print(-2,"\t-L num : max last-gasp number of conflicts in mitering [default = %d]\n",
            (ulong)(uint)local_90.nMiteringLimitLast);
  Abc_Print(-2,"\t-I num : max number of clause inspections in all SAT calls [default = %d]\n",
            local_90.nTotalInspectLimit & 0xffffffff);
  pcVar7 = "yes";
  pcVar8 = "yes";
  if (local_90.fUseRewriting == 0) {
    pcVar8 = "no";
  }
  Abc_Print(-2,"\t-r     : toggle the use of rewriting [default = %s]\n",pcVar8);
  pcVar8 = "yes";
  if (local_90.fUseFraiging == 0) {
    pcVar8 = "no";
  }
  Abc_Print(-2,"\t-f     : toggle the use of FRAIGing [default = %s]\n",pcVar8);
  pcVar8 = "yes";
  if (local_90.fUseBdds == 0) {
    pcVar8 = "no";
  }
  Abc_Print(-2,"\t-b     : toggle the use of BDDs [default = %s]\n",pcVar8);
  if (local_90.fVerbose == 0) {
    pcVar7 = "no";
  }
  Abc_Print(-2,"\t-v     : prints verbose information [default = %s]\n",pcVar7);
  pcVar8 = "\t-h     : print the command usage\n";
  iVar3 = -2;
LAB_0021eadc:
  Abc_Print(iVar3,pcVar8);
  return 1;
  while (uVar6 = uVar6 + 1, uVar2 != uVar6) {
LAB_0021eb79:
    if (__ptr[uVar6] == 1) {
      uVar9 = uVar6 & 0xffffffff;
      goto LAB_0021eb90;
    }
  }
  uVar6 = (ulong)uVar2;
LAB_0021eb90:
  if ((uint)uVar6 == uVar2) {
    Abc_Print(1,"ERROR in Abc_NtkMiterProve(): Generated counter-example is invalid.\n");
  }
  if (__ptr != (int *)0x0) {
    free(__ptr);
  }
LAB_0021ebb4:
  p->Status = iVar3;
  if (iVar3 == -1) {
    pcVar8 = "UNDECIDED      ";
  }
  else {
    if (iVar3 == 0) {
      pcVar8 = "SATISFIABLE (output = %d) ";
      Abc_Print(1,"SATISFIABLE (output = %d) ",uVar9);
      goto LAB_0021ebf7;
    }
    pcVar8 = "UNSATISFIABLE  ";
  }
  Abc_Print(1,pcVar8);
LAB_0021ebf7:
  aVar5 = Abc_Clock();
  Abc_PrintTime((int)aVar5 - (int)aVar4,pcVar8,time);
  Abc_FrameReplaceCurrentNetwork(p,local_a8);
  if ((iVar3 == 0) && (local_a8->nObjCounts[8] == 0)) {
    local_38 = Abc_CexDeriveFromCombModel(local_a8->pModel,local_a8->vPis->nSize,0,(int)uVar9);
    Abc_FrameReplaceCex(p,&local_38);
  }
  return 0;
}

Assistant:

int Abc_CommandIProve( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Prove_Params_t Params, * pParams = &Params;
    Abc_Ntk_t * pNtk, * pNtkTemp;
    int c, RetValue, iOut = -1;
    abctime clk;

    extern int Abc_NtkIvyProve( Abc_Ntk_t ** ppNtk, void * pPars );

    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    Prove_ParamsSetDefault( pParams );
    pParams->fUseRewriting = 1;
    pParams->fVerbose      = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "NCFGLIrfbvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            pParams->nItersMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pParams->nItersMax < 0 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            pParams->nMiteringLimitStart = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pParams->nMiteringLimitStart < 0 )
                goto usage;
            break;
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            pParams->nFraigingLimitStart = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pParams->nFraigingLimitStart < 0 )
                goto usage;
            break;
        case 'G':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-G\" should be followed by an integer.\n" );
                goto usage;
            }
            pParams->nFraigingLimitMulti = (float)atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pParams->nFraigingLimitMulti < 0 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            pParams->nMiteringLimitLast = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pParams->nMiteringLimitLast < 0 )
                goto usage;
            break;
        case 'I':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-I\" should be followed by an integer.\n" );
                goto usage;
            }
            pParams->nTotalInspectLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pParams->nTotalInspectLimit < 0 )
                goto usage;
            break;
        case 'r':
            pParams->fUseRewriting ^= 1;
            break;
        case 'f':
            pParams->fUseFraiging ^= 1;
            break;
        case 'b':
            pParams->fUseBdds ^= 1;
            break;
        case 'v':
            pParams->fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }

    if ( Abc_NtkLatchNum(pNtk) > 0 )
    {
        Abc_Print( -1, "The network has registers. Use \"dprove\".\n" );
        return 1;
    }

    clk = Abc_Clock();

    if ( Abc_NtkIsStrash(pNtk) )
        pNtkTemp = Abc_NtkDup( pNtk );
    else
        pNtkTemp = Abc_NtkStrash( pNtk, 0, 0, 0 );

    RetValue = Abc_NtkIvyProve( &pNtkTemp, pParams );

    // verify that the pattern is correct
    if ( RetValue == 0 )
    {
        Abc_Obj_t * pObj;
        int i;
        int * pSimInfo = Abc_NtkVerifySimulatePattern( pNtk, pNtkTemp->pModel );
        Abc_NtkForEachCo( pNtk, pObj, i )
            if ( pSimInfo[i] == 1 )
            {
                iOut = i;
                break;
            }
        if ( i == Abc_NtkCoNum(pNtk) )
            Abc_Print( 1, "ERROR in Abc_NtkMiterProve(): Generated counter-example is invalid.\n" );
        ABC_FREE( pSimInfo );
    }
    pAbc->Status = RetValue;
    if ( RetValue == -1 )
        Abc_Print( 1, "UNDECIDED      " );
    else if ( RetValue == 0 )
        Abc_Print( 1, "SATISFIABLE (output = %d) ", iOut );
    else
        Abc_Print( 1, "UNSATISFIABLE  " );
    //Abc_Print( -1, "\n" );

    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkTemp );
    // update counter example
    if ( RetValue == 0 && Abc_NtkLatchNum(pNtkTemp) == 0 )
    {
        Abc_Cex_t * pCex = Abc_CexDeriveFromCombModel( pNtkTemp->pModel, Abc_NtkPiNum(pNtkTemp), 0, iOut );
        Abc_FrameReplaceCex( pAbc, &pCex );
    }
    return 0;

usage:
    Abc_Print( -2, "usage: iprove [-NCFGLI num] [-rfbvh]\n" );
    Abc_Print( -2, "\t         performs CEC using a new method\n" );
    Abc_Print( -2, "\t-N num : max number of iterations [default = %d]\n", pParams->nItersMax );
    Abc_Print( -2, "\t-C num : max starting number of conflicts in mitering [default = %d]\n", pParams->nMiteringLimitStart );
    Abc_Print( -2, "\t-F num : max starting number of conflicts in fraiging [default = %d]\n", pParams->nFraigingLimitStart );
    Abc_Print( -2, "\t-G num : multiplicative coefficient for fraiging [default = %d]\n", (int)pParams->nFraigingLimitMulti );
    Abc_Print( -2, "\t-L num : max last-gasp number of conflicts in mitering [default = %d]\n", pParams->nMiteringLimitLast );
    Abc_Print( -2, "\t-I num : max number of clause inspections in all SAT calls [default = %d]\n", (int)pParams->nTotalInspectLimit );
    Abc_Print( -2, "\t-r     : toggle the use of rewriting [default = %s]\n", pParams->fUseRewriting? "yes": "no" );
    Abc_Print( -2, "\t-f     : toggle the use of FRAIGing [default = %s]\n", pParams->fUseFraiging? "yes": "no" );
    Abc_Print( -2, "\t-b     : toggle the use of BDDs [default = %s]\n", pParams->fUseBdds? "yes": "no" );
    Abc_Print( -2, "\t-v     : prints verbose information [default = %s]\n", pParams->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}